

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::RegisterPolymer(Model *this,Ptr *polymer)

{
  element_type *peVar1;
  shared_ptr<PolymerWrapper> wrapper;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::make_shared<PolymerWrapper,std::shared_ptr<Polymer>&>((shared_ptr<Polymer> *)&local_40);
  peVar1 = (polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,&local_40);
  std::__weak_ptr<PolymerWrapper,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<PolymerWrapper,(__gnu_cxx::_Lock_policy)2> *)&peVar1->wrapper_,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<PolymerWrapper,void>
            (local_50,&local_40);
  Gillespie::LinkReaction(&this->gillespie_,(Ptr *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void Model::RegisterPolymer(Polymer::Ptr polymer) {
  // Encapsulate polymer in PolymerWrapper reaction and add to reaction list
  auto wrapper = std::make_shared<PolymerWrapper>(polymer);
  polymer->wrapper(wrapper);
  gillespie_.LinkReaction(wrapper);
}